

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O1

void ParsePhdr(SFFile *sf2,FileReader *f,DWORD chunkid,DWORD chunklen)

{
  uint uVar1;
  int iVar2;
  undefined8 in_RAX;
  SFPreset *pSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined8 uVar4;
  pointer_____offset_0x10___ *ppuVar5;
  uint uVar6;
  WORD x;
  WORD x_1;
  WORD x_2;
  undefined8 uStack_38;
  
  if (0x4b < chunklen) {
    uVar1 = chunklen >> 1;
    uVar6 = uVar1 / 0x13;
    if (chunklen == (uVar1 / 0x13) * 0x26) {
      sf2->NumPresets = uVar1 / 0x13;
      uStack_38 = in_RAX;
      pSVar3 = (SFPreset *)operator_new__((ulong)((uVar1 / 0x13) * 0x1b + uVar1 / 0x13));
      sf2->Presets = pSVar3;
      while( true ) {
        iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,pSVar3,0x14);
        if (CONCAT44(extraout_var,iVar2) != 0x14) break;
        pSVar3->Name[0x14] = '\0';
        iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 2,2);
        if (CONCAT44(extraout_var_00,iVar2) != 2) break;
        pSVar3->Program = uStack_38._2_2_;
        iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 4,2);
        if (CONCAT44(extraout_var_01,iVar2) != 2) break;
        pSVar3->Bank = uStack_38._4_2_;
        iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[2])(f,(long)&uStack_38 + 6,2);
        if (CONCAT44(extraout_var_02,iVar2) != 2) break;
        pSVar3->BagIndex = uStack_38._6_2_;
        iVar2 = (*(f->super_FileReaderBase)._vptr_FileReaderBase[4])(f,0xc,1);
        if (CONCAT44(extraout_var_03,iVar2) != 0) break;
        if ((pSVar3 != sf2->Presets) && (pSVar3->BagIndex < pSVar3[-1].BagIndex)) goto LAB_003265da;
        pSVar3 = pSVar3 + 1;
        uVar6 = uVar6 - 1;
        if (uVar6 == 0) {
          return;
        }
      }
      uVar4 = __cxa_allocate_exception(1);
      ppuVar5 = &CIOErr::typeinfo;
      goto LAB_003265d0;
    }
  }
LAB_003265da:
  uVar4 = __cxa_allocate_exception(1);
  ppuVar5 = &CBadForm::typeinfo;
LAB_003265d0:
  __cxa_throw(uVar4,ppuVar5,0);
}

Assistant:

static void ParsePhdr(SFFile *sf2, FileReader *f, DWORD chunkid, DWORD chunklen)
{
	SFPreset *preset;

	// Section 7.2, page 22:
	//		If the PHDR sub-chunk is missing, or contains fewer than two records,
	//		or its size is not a multiple of 38 bytes, the file should be rejected
	//		as structurally unsound.
	if (chunklen < 38*2 || chunklen % 38 != 0)
	{
		throw CBadForm();
	}

	sf2->NumPresets = chunklen / 38;
	sf2->Presets = new SFPreset[sf2->NumPresets];
	preset = sf2->Presets;

	for (int i = sf2->NumPresets; i != 0; --i, ++preset)
	{
		read_name(f, preset->Name);
		preset->Program = read_uword(f);
		preset->Bank = read_uword(f);
		preset->BagIndex = read_uword(f);
		skip_chunk(f, 4*3);	// Skip library, genre, and morphology

		// Section 7.2, page 22:
		//		The preset bag indices will be monotonically increasing with
		//		increasing preset headers.
		if (preset != sf2->Presets)
		{
			if (preset->BagIndex < (preset - 1)->BagIndex)
			{
				throw CBadForm();
			}
		}
	}
}